

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoveCardsOperationSnapshotCreator.cpp
# Opt level: O1

unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
 __thiscall
solitaire::archivers::MoveCardsOperationSnapshotCreator::createSnapshotIfCardsMovedToOtherPile
          (MoveCardsOperationSnapshotCreator *this,
          unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
          *destinationPileSnapshot)

{
  Snapshot *pSVar1;
  Snapshot *pSVar2;
  int iVar3;
  _func_int **pp_Var4;
  unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
  *in_RDX;
  MoveCardsOperationSnapshotCreator *this_00;
  
  this_00 = (MoveCardsOperationSnapshotCreator *)destinationPileSnapshot;
  throwIfSourcePileSnapshotIsNullptr((MoveCardsOperationSnapshotCreator *)destinationPileSnapshot);
  throwIfSnapshotIsNullptr(this_00,in_RDX);
  pSVar1 = destinationPileSnapshot[1]._M_t.
           super___uniq_ptr_impl<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
           ._M_t.
           super__Tuple_impl<0UL,_solitaire::archivers::interfaces::Snapshot_*,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
           .super__Head_base<0UL,_solitaire::archivers::interfaces::Snapshot_*,_false>._M_head_impl;
  iVar3 = (*pSVar1->_vptr_Snapshot[3])
                    (pSVar1,(in_RDX->_M_t).
                            super___uniq_ptr_impl<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_solitaire::archivers::interfaces::Snapshot_*,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
                            .
                            super__Head_base<0UL,_solitaire::archivers::interfaces::Snapshot_*,_false>
                            ._M_head_impl);
  if ((char)iVar3 == '\0') {
    pp_Var4 = (_func_int **)operator_new(0x18);
    pSVar1 = destinationPileSnapshot[1]._M_t.
             super___uniq_ptr_impl<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
             ._M_t.
             super__Tuple_impl<0UL,_solitaire::archivers::interfaces::Snapshot_*,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
             .super__Head_base<0UL,_solitaire::archivers::interfaces::Snapshot_*,_false>.
             _M_head_impl;
    destinationPileSnapshot[1]._M_t.
    super___uniq_ptr_impl<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
    ._M_t.
    super__Tuple_impl<0UL,_solitaire::archivers::interfaces::Snapshot_*,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
    .super__Head_base<0UL,_solitaire::archivers::interfaces::Snapshot_*,_false>._M_head_impl =
         (Snapshot *)0x0;
    pSVar2 = (in_RDX->_M_t).
             super___uniq_ptr_impl<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
             ._M_t.
             super__Tuple_impl<0UL,_solitaire::archivers::interfaces::Snapshot_*,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
             .super__Head_base<0UL,_solitaire::archivers::interfaces::Snapshot_*,_false>.
             _M_head_impl;
    (in_RDX->_M_t).
    super___uniq_ptr_impl<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
    ._M_t.
    super__Tuple_impl<0UL,_solitaire::archivers::interfaces::Snapshot_*,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
    .super__Head_base<0UL,_solitaire::archivers::interfaces::Snapshot_*,_false>._M_head_impl =
         (Snapshot *)0x0;
    *pp_Var4 = (_func_int *)&PTR__Snapshot_00333618;
    pp_Var4[1] = (_func_int *)pSVar1;
    pp_Var4[2] = (_func_int *)pSVar2;
  }
  else {
    pSVar1 = destinationPileSnapshot[1]._M_t.
             super___uniq_ptr_impl<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
             ._M_t.
             super__Tuple_impl<0UL,_solitaire::archivers::interfaces::Snapshot_*,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
             .super__Head_base<0UL,_solitaire::archivers::interfaces::Snapshot_*,_false>.
             _M_head_impl;
    destinationPileSnapshot[1]._M_t.
    super___uniq_ptr_impl<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
    ._M_t.
    super__Tuple_impl<0UL,_solitaire::archivers::interfaces::Snapshot_*,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
    .super__Head_base<0UL,_solitaire::archivers::interfaces::Snapshot_*,_false>._M_head_impl =
         (Snapshot *)0x0;
    if (pSVar1 != (Snapshot *)0x0) {
      (*pSVar1->_vptr_Snapshot[1])();
    }
    (this->super_MoveCardsOperationSnapshotCreator)._vptr_MoveCardsOperationSnapshotCreator =
         (_func_int **)0x0;
    pp_Var4 = (_func_int **)0x0;
  }
  (this->super_MoveCardsOperationSnapshotCreator)._vptr_MoveCardsOperationSnapshotCreator = pp_Var4;
  return (__uniq_ptr_data<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>,_true,_true>
          )(__uniq_ptr_data<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<interfaces::Snapshot>
MoveCardsOperationSnapshotCreator::createSnapshotIfCardsMovedToOtherPile(
    std::unique_ptr<interfaces::Snapshot> destinationPileSnapshot)
{
    throwIfSourcePileSnapshotIsNullptr();
    throwIfSnapshotIsNullptr(destinationPileSnapshot);

    if (sourcePileSnapshot->isSnapshotOfSameObject(*destinationPileSnapshot))
    {
        sourcePileSnapshot = nullptr;
        return nullptr;
    }

    return std::make_unique<Snapshot>(
        std::move(sourcePileSnapshot), std::move(destinationPileSnapshot)
    );
}